

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_fetch_backward_init(uchar **ppin,uchar *pinend,uint64_t *pval,uint *pbits)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int local_4c;
  ulong uStack_48;
  uint bits;
  uint64_t val;
  byte *pbStack_38;
  uint stream_start;
  uchar *pin;
  uint *pbits_local;
  uint64_t *pval_local;
  uchar *pinend_local;
  uchar **ppin_local;
  
  pbStack_38 = *ppin;
  bVar1 = *pbStack_38;
  if (bVar1 == 0) {
    elf_uncompress_failed();
    ppin_local._4_4_ = 0;
  }
  else {
    uStack_48 = 0;
    local_4c = 0;
    for (; ((ulong)pbStack_38 & 3) != 0; pbStack_38 = pbStack_38 + -1) {
      uStack_48 = (ulong)*pbStack_38 | uStack_48 << 8;
      local_4c = local_4c + 8;
    }
    bVar2 = *pbStack_38;
    *ppin = pbStack_38;
    *pval = (ulong)bVar2 | uStack_48 << 8;
    *pbits = local_4c + 8;
    iVar4 = elf_fetch_bits_backward(ppin,pinend,pval,pbits);
    if (iVar4 == 0) {
      ppin_local._4_4_ = 0;
    }
    else {
      uVar3 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      *pbits = *pbits - ((uVar3 ^ 0x1f) - 0x17);
      iVar4 = elf_fetch_bits_backward(ppin,pinend,pval,pbits);
      if (iVar4 == 0) {
        ppin_local._4_4_ = 0;
      }
      else {
        ppin_local._4_4_ = 1;
      }
    }
  }
  return ppin_local._4_4_;
}

Assistant:

static int
elf_fetch_backward_init (const unsigned char **ppin,
			 const unsigned char *pinend,
			 uint64_t *pval, unsigned int *pbits)
{
  const unsigned char *pin;
  unsigned int stream_start;
  uint64_t val;
  unsigned int bits;

  pin = *ppin;
  stream_start = (unsigned int)*pin;
  if (unlikely (stream_start == 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  val = 0;
  bits = 0;

  /* Align to a 32-bit boundary.  */
  while ((((uintptr_t)pin) & 3) != 0)
    {
      val <<= 8;
      val |= (uint64_t)*pin;
      bits += 8;
      --pin;
    }

  val <<= 8;
  val |= (uint64_t)*pin;
  bits += 8;

  *ppin = pin;
  *pval = val;
  *pbits = bits;
  if (!elf_fetch_bits_backward (ppin, pinend, pval, pbits))
    return 0;

  *pbits -= __builtin_clz (stream_start) - (sizeof (unsigned int) - 1) * 8 + 1;

  if (!elf_fetch_bits_backward (ppin, pinend, pval, pbits))
    return 0;

  return 1;
}